

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<true,_false,_true>::insert_block_link_
          (DaTrie<true,_false,_true> *this,uint32_t block_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint uVar1;
  uint uVar2;
  pointer pBVar3;
  ulong uVar4;
  
  uVar1 = this->head_pos_;
  uVar4 = (ulong)uVar1;
  pBVar3 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar4 != 0xffffffff) {
    uVar2 = pBVar3[uVar4].prev;
    pBVar3[block_pos].prev = uVar2;
    pBVar3[block_pos].next = uVar1;
    pBVar3[uVar2].next = block_pos;
    pBVar3[uVar4].prev = block_pos;
    return;
  }
  pBVar3[block_pos].next = block_pos;
  pBVar3[block_pos].prev = block_pos;
  this->head_pos_ = block_pos;
  return;
}

Assistant:

void insert_block_link_(uint32_t block_pos, std::vector<BlockLink>& blocks) {
    assert(block_pos < blocks.size());

    if (head_pos_ != NOT_FOUND) {
      auto tail_pos = blocks[head_pos_].prev;
      blocks[block_pos].prev = tail_pos;
      blocks[block_pos].next = head_pos_;
      blocks[tail_pos].next = block_pos;
      blocks[head_pos_].prev = block_pos;
    } else {
      blocks[block_pos].next = block_pos;
      blocks[block_pos].prev = block_pos;
      head_pos_ = block_pos;
    }
  }